

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

int av1_set_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  iVar7 = -1;
  if (((cpi->common).mi_params.mb_rows == rows) && ((cpi->common).mi_params.mb_cols == cols)) {
    puVar3 = (cpi->active_map).map;
    iVar7 = (cpi->common).mi_params.mi_rows;
    iVar2 = (cpi->common).mi_params.mi_cols;
    (cpi->active_map).update = 0;
    (cpi->rc).percent_blocks_inactive = 0;
    if (new_map_16x16 != (uchar *)0x0) {
      lVar10 = (long)iVar7;
      iVar17 = 0;
      uVar11 = 0;
      iVar13 = 0;
      iVar8 = 0;
      while( true ) {
        iVar15 = 4;
        if (iVar7 < 4) {
          iVar15 = iVar7;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        if (lVar10 <= (long)uVar11) break;
        iVar16 = iVar17;
        for (uVar12 = 0; (long)uVar12 < (long)iVar2; uVar12 = uVar12 + 4) {
          iVar9 = 0;
          uVar1 = new_map_16x16[(uVar12 >> 2) + (uVar11 >> 2) * (long)cols];
          uVar6 = '\0';
          if (uVar1 == '\0') {
            uVar6 = '\a';
          }
          iVar4 = iVar2 - (int)uVar12;
          if (3 < iVar4) {
            iVar4 = 4;
          }
          iVar14 = iVar16;
          for (; iVar9 != iVar15; iVar9 = iVar9 + 1) {
            for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
              puVar3[(int)lVar5 + iVar14] = uVar6;
            }
            iVar14 = iVar14 + iVar2;
          }
          iVar8 = iVar8 + 1;
          iVar13 = iVar13 + (uint)(uVar1 == '\0');
          iVar16 = iVar16 + 4;
        }
        uVar11 = uVar11 + 4;
        iVar7 = iVar7 + -4;
        iVar17 = iVar17 + iVar2 * 4;
      }
      (cpi->active_map).enabled = 1;
      (cpi->active_map).update = 1;
      (cpi->rc).percent_blocks_inactive = (iVar13 * 100) / iVar8;
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int av1_set_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols) {
    unsigned char *const active_map_4x4 = cpi->active_map.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    cpi->active_map.update = 0;
    cpi->rc.percent_blocks_inactive = 0;
    assert(mi_rows % 2 == 0 && mi_rows > 0);
    assert(mi_cols % 2 == 0 && mi_cols > 0);
    if (new_map_16x16) {
      int num_samples = 0;
      int num_blocks_inactive = 0;
      for (int r = 0; r < mi_rows; r += 4) {
        for (int c = 0; c < mi_cols; c += 4) {
          const uint8_t val = new_map_16x16[(r >> 2) * cols + (c >> 2)]
                                  ? AM_SEGMENT_ID_ACTIVE
                                  : AM_SEGMENT_ID_INACTIVE;
          num_samples++;
          if (val == AM_SEGMENT_ID_INACTIVE) num_blocks_inactive++;
          const int row_max = AOMMIN(4, mi_rows - r);
          const int col_max = AOMMIN(4, mi_cols - c);
          for (int x = 0; x < row_max; ++x) {
            for (int y = 0; y < col_max; ++y) {
              active_map_4x4[(r + x) * mi_cols + (c + y)] = val;
            }
          }
        }
      }
      cpi->active_map.enabled = 1;
      cpi->active_map.update = 1;
      assert(num_samples);
      cpi->rc.percent_blocks_inactive =
          (num_blocks_inactive * 100) / num_samples;
    }
    return 0;
  }

  return -1;
}